

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec * cram_subexp_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte *pbVar1;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  char *cp;
  cram_codec *c;
  int version_local;
  cram_external_type option_local;
  int size_local;
  char *data_local;
  
  data_local = (char *)malloc(0x240);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    data_local[0] = '\a';
    data_local[1] = '\0';
    data_local[2] = '\0';
    data_local[3] = '\0';
    *(code **)(data_local + 0x18) = cram_subexp_decode;
    *(code **)(data_local + 0x10) = cram_subexp_decode_free;
    if ((byte)*data < 0x80) {
      *(uint *)(data_local + 0x30) = (uint)(byte)*data;
      local_3c = 1;
    }
    else {
      if ((byte)*data < 0xc0) {
        *(uint *)(data_local + 0x30) = CONCAT11(*data,data[1]) & 0x3fff;
        local_40 = 2;
      }
      else {
        if ((byte)*data < 0xe0) {
          *(uint *)(data_local + 0x30) =
               ((byte)*data & 0x1f) << 0x10 | (uint)(byte)data[1] << 8 | (uint)(byte)data[2];
          local_44 = 3;
        }
        else {
          if ((byte)*data < 0xf0) {
            *(uint *)(data_local + 0x30) =
                 ((byte)*data & 0xf) << 0x18 | (uint)(byte)data[1] << 0x10 |
                 (uint)(byte)data[2] << 8 | (uint)(byte)data[3];
            local_48 = 4;
          }
          else {
            *(uint *)(data_local + 0x30) =
                 (uint)(byte)*data << 0x1c | (uint)(byte)data[1] << 0x14 |
                 (uint)(byte)data[2] << 0xc | (uint)(byte)data[3] << 4 | (byte)data[4] & 0xf;
            local_48 = 5;
          }
          local_44 = local_48;
        }
        local_40 = local_44;
      }
      local_3c = local_40;
    }
    pbVar1 = (byte *)(data + local_3c);
    if (*pbVar1 < 0x80) {
      *(uint *)(data_local + 0x34) = (uint)*pbVar1;
      local_4c = 1;
    }
    else {
      if (*pbVar1 < 0xc0) {
        *(uint *)(data_local + 0x34) = CONCAT11(*pbVar1,pbVar1[1]) & 0x3fff;
        local_50 = 2;
      }
      else {
        if (*pbVar1 < 0xe0) {
          *(uint *)(data_local + 0x34) =
               (*pbVar1 & 0x1f) << 0x10 | (uint)pbVar1[1] << 8 | (uint)pbVar1[2];
          local_54 = 3;
        }
        else {
          if (*pbVar1 < 0xf0) {
            *(uint *)(data_local + 0x34) =
                 (*pbVar1 & 0xf) << 0x18 | (uint)pbVar1[1] << 0x10 | (uint)pbVar1[2] << 8 |
                 (uint)pbVar1[3];
            local_58 = 4;
          }
          else {
            *(uint *)(data_local + 0x34) =
                 (uint)*pbVar1 << 0x1c | (uint)pbVar1[1] << 0x14 | (uint)pbVar1[2] << 0xc |
                 (uint)pbVar1[3] << 4 | pbVar1[4] & 0xf;
            local_58 = 5;
          }
          local_54 = local_58;
        }
        local_50 = local_54;
      }
      local_4c = local_50;
    }
    if (pbVar1 + ((long)local_4c - (long)data) != (byte *)(long)size) {
      fprintf(_stderr,"Malformed subexp header stream\n");
      free(data_local);
      data_local = (char *)0x0;
    }
  }
  return (cram_codec *)data_local;
}

Assistant:

cram_codec *cram_subexp_decode_init(char *data, int size,
				    enum cram_external_type option,
				    int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_SUBEXP;
    c->decode = cram_subexp_decode;
    c->free   = cram_subexp_decode_free;
    
    cp += itf8_get(cp, &c->subexp.offset);
    cp += itf8_get(cp, &c->subexp.k);

    if (cp - data != size) {
	fprintf(stderr, "Malformed subexp header stream\n");
	free(c);
	return NULL;
    }

    return c;
}